

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

float __thiscall lrit::ImageNavigationHeader::getLongitude(ImageNavigationHeader *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  float fVar4;
  string local_50;
  string name;
  
  std::__cxx11::string::string((string *)&name,(string *)&this->projectionName);
  cVar3 = (char)&name;
  lVar1 = std::__cxx11::string::find(cVar3,0x28);
  lVar2 = std::__cxx11::string::find(cVar3,0x29);
  fVar4 = 0.0;
  if (lVar2 != -1 && lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&name);
    fVar4 = std::__cxx11::stof(&local_50,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&name);
  return fVar4;
}

Assistant:

float ImageNavigationHeader::getLongitude() const {
  auto name = std::string(projectionName);
  auto lpos = name.find('(');
  auto rpos = name.find(')');
  if (lpos == std::string::npos || rpos == std::string::npos) {
    return 0.0;
  }
  return std::stof(name.substr(lpos + 1, rpos - (lpos + 1)));
}